

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFrame.h
# Opt level: O1

void __thiscall
chrono::ChFrame<double>::TransformLocalToParent
          (ChFrame<double> *this,ChFrame<double> *local,ChFrame<double> *parent)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  ChQuaternion<double> q;
  ChVector<double> local_60;
  ChQuaternion<double> local_48;
  
  ChTransform<double>::TransformLocalToParent(&(local->coord).pos,&(this->coord).pos,&this->Amatrix)
  ;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = (this->coord).rot.m_data[0];
  dVar1 = (this->coord).rot.m_data[1];
  auVar6._8_8_ = 0;
  auVar6._0_8_ = dVar1;
  dVar2 = (local->coord).rot.m_data[0];
  auVar7._8_8_ = 0;
  auVar7._0_8_ = dVar2;
  dVar3 = (local->coord).rot.m_data[1];
  auVar9._8_8_ = 0;
  auVar9._0_8_ = dVar3;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = dVar3 * dVar1;
  auVar7 = vfmsub231sd_fma(auVar10,auVar5,auVar7);
  dVar3 = (this->coord).rot.m_data[2];
  auVar11._8_8_ = 0;
  auVar11._0_8_ = dVar3;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = (local->coord).rot.m_data[2];
  auVar7 = vfnmadd231sd_fma(auVar7,auVar11,auVar12);
  dVar4 = (this->coord).rot.m_data[3];
  auVar13._8_8_ = 0;
  auVar13._0_8_ = dVar4;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = (local->coord).rot.m_data[3];
  auVar10 = vfnmadd231sd_fma(auVar7,auVar13,auVar14);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = dVar2 * dVar1;
  auVar7 = vfmadd231sd_fma(auVar15,auVar5,auVar9);
  auVar7 = vfnmadd231sd_fma(auVar7,auVar13,auVar12);
  auVar7 = vfmadd231sd_fma(auVar7,auVar11,auVar14);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = dVar2 * dVar3;
  auVar8 = vfmadd231sd_fma(auVar16,auVar5,auVar12);
  auVar8 = vfmadd231sd_fma(auVar8,auVar13,auVar9);
  auVar13 = vfnmadd231sd_fma(auVar8,auVar6,auVar14);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = dVar2 * dVar4;
  auVar8 = vfmadd231sd_fma(auVar8,auVar5,auVar14);
  auVar8 = vfnmadd231sd_fma(auVar8,auVar11,auVar9);
  auVar8 = vfmadd231sd_fma(auVar8,auVar6,auVar12);
  local_48.m_data[0] = auVar10._0_8_;
  local_48.m_data[1] = auVar7._0_8_;
  local_48.m_data[2] = auVar13._0_8_;
  local_48.m_data[3] = auVar8._0_8_;
  SetCoord(parent,&local_60,&local_48);
  return;
}

Assistant:

void TransformLocalToParent(
        const ChFrame<Real>& local,  ///< frame to transform, given in local frame coordinates
        ChFrame<Real>& parent        ///< transformed frame, in parent coordinates, will be stored here
        ) const {
        parent.SetCoord(TransformLocalToParent(local.coord.pos), coord.rot % local.coord.rot);
    }